

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  BasicHeapType id;
  Nullability nullability_00;
  Exactness exactness_00;
  Iterator IVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Type local_b8;
  Type subType;
  Exactness exactness;
  Nullability nullability;
  HeapType local_98;
  HeapType local_90;
  HeapType heapType;
  value_type local_80;
  uintptr_t *local_78;
  Type *t;
  Iterator __end2;
  undefined1 local_50 [8];
  Iterator __begin2;
  Type *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isTuple((Type *)&this_local);
  if (bVar1) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&this_local;
    IVar2 = Type::begin((Type *)__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    local_50 = (undefined1  [8])
               IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar3 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
    while( true ) {
      __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar3.index;
      t = PVar3.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_50,
                         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
      if (!bVar1) break;
      local_78 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_50);
      heapType.id = *local_78;
      local_80.id = (uintptr_t)getSubType(this,heapType.id);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2,&local_80);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_50);
      PVar3.index = (size_t)__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar3.parent = t;
    }
    ::wasm::Type::Type(&type_local,(vector *)&__range2);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
  }
  else {
    bVar1 = Type::isRef((Type *)&this_local);
    if (bVar1) {
      local_90 = Type::getHeapType((Type *)&this_local);
      if ((this->funcContext == (FunctionCreationContext *)0x0) &&
         (bVar1 = HeapType::isMaybeShared(&local_90,exn), bVar1)) {
        type_local.id = (uintptr_t)this_local;
      }
      else {
        bVar1 = Type::isExact((Type *)&this_local);
        if (bVar1) {
          bVar1 = HeapType::isBottom(&local_90);
          if ((!bVar1) && (bVar1 = oneIn(this,0x14), bVar1)) {
            id = HeapType::getBottom(&local_90);
            HeapType::HeapType(&local_98,id);
            local_90.id = local_98.id;
          }
        }
        else {
          local_90 = getSubType(this,local_90);
        }
        nullability_00 = Type::getNullability((Type *)&this_local);
        subType.id._4_4_ = getSubType(this,nullability_00);
        exactness_00 = Type::getExactness((Type *)&this_local);
        subType.id._0_4_ = getSubType(this,exactness_00);
        Type::Type(&local_b8,local_90,subType.id._4_4_,(Exactness)subType.id);
        bVar1 = GCTypeUtils::isUninhabitable(local_b8);
        if (((!bVar1) || (bVar1 = GCTypeUtils::isUninhabitable((Type)this_local), bVar1)) ||
           (bVar1 = oneIn(this,0x14), bVar1)) {
          type_local.id = local_b8.id;
        }
        else {
          type_local.id = (uintptr_t)this_local;
        }
      }
    }
    else {
      bVar1 = Type::isBasic((Type *)&this_local);
      if (!bVar1) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x15b9,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
      type_local.id = (uintptr_t)this_local;
    }
  }
  return (Type)type_local.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    // Do not generate non-nullable exnrefs in global positions (they cannot be
    // created in wasm, nor imported from JS).
    if (!funcContext && heapType.isMaybeShared(HeapType::exn)) {
      return type;
    }
    if (type.isExact()) {
      // The only other possible heap type is bottom, but we don't want to
      // generate too many bottom types.
      if (!heapType.isBottom() && oneIn(20)) {
        heapType = heapType.getBottom();
      }
    } else {
      heapType = getSubType(heapType);
    }
    auto nullability = getSubType(type.getNullability());
    auto exactness = getSubType(type.getExactness());
    auto subType = Type(heapType, nullability, exactness);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (GCTypeUtils::isUninhabitable(subType) &&
        !GCTypeUtils::isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}